

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareShaderStage
          (VaryingComponentsTest *this,STAGES stage,Type *vector_type,
          ProgramInterface *program_interface,testCase *test_case,
          VaryingPassthrough *varying_passthrough)

{
  VaryingComponentsTest *pVVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  GLuint array_length;
  GLuint last_in_location;
  GLuint last_out_location;
  ShaderInterface *si;
  Variable *in;
  Variable *out;
  char *pcVar6;
  TestContext **ppTVar7;
  TYPES TVar8;
  VaryingComponentsTest *this_00;
  VaryingComponentsTest *pVVar9;
  char **ppcVar10;
  char *pcVar11;
  TestNodeType *pTVar12;
  char **ppcVar13;
  TestContext **ppTVar14;
  bool *interpolation;
  TYPES *pTVar15;
  long lVar16;
  TYPES TVar17;
  long lStackY_3c0;
  char **local_3b0;
  GLuint *local_3a8;
  char **local_3a0;
  TYPES *local_398;
  descriptor desc_in [8];
  undefined1 local_1e8 [40];
  TestContext *local_1c0;
  TYPES local_1b8 [2];
  char *local_1b0;
  GLuint local_1a8 [2];
  char *local_1a0;
  TYPES local_198 [2];
  TestContext *local_190;
  TYPES local_188;
  char *local_180;
  TestNodeType local_178 [2];
  char *local_170;
  undefined1 local_168 [40];
  char *local_140;
  TYPES local_138 [2];
  TestContext *local_130;
  undefined1 local_128 [8];
  char *local_120;
  TestNodeType local_118 [2];
  char *local_110;
  undefined1 local_108 [40];
  char *local_e0;
  TYPES local_d8 [2];
  TestContext *local_d0;
  undefined1 local_c8 [16];
  TestNodeType local_b8 [2];
  char *local_b0;
  undefined1 local_a8 [48];
  TYPES local_78 [2];
  TestContext *local_70;
  undefined1 local_68 [16];
  TestNodeType local_58;
  string local_50;
  
  pVVar1 = (VaryingComponentsTest *)(ulong)stage;
  local_68._0_8_ = varying_passthrough;
  array_length = (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.
                                    super_TestBase.super_TestCase.super_TestCase.super_TestNode.
                                    _vptr_TestNode + 0x110))();
  local_68._8_8_ = (ulong)vector_type->m_basic_type | 0x100000000;
  local_58 = NODETYPE_PACKAGE;
  last_in_location = TestBase::getLastInputLocation((TestBase *)this,stage,vector_type,array_length)
  ;
  this_00 = pVVar1;
  si = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  interpolation = glcts::fixed_sample_locations_values + 1;
  if ((stage & ~VERTEX) == GEOMETRY) {
    interpolation = (bool *)0x165b1ff;
  }
  last_out_location = 0;
  if (stage != FRAGMENT) {
    this_00 = pVVar1;
    last_out_location =
         TestBase::getLastOutputLocation((TestBase *)this,stage,vector_type,array_length);
  }
  if (SCALAR_SCALAR_SCALAR_SCALAR < test_case->m_layout) {
    lStackY_3c0 = 0;
    goto LAB_00963590;
  }
  local_3a0 = &local_140;
  local_3a8 = (GLuint *)(local_168 + 0x20);
  local_3b0 = (char **)(local_168 + 0x18);
  local_398 = (TYPES *)(local_168 + 0x10);
  ppTVar7 = (TestContext **)(local_168 + 8);
  pVVar9 = (VaryingComponentsTest *)local_108;
  this_00 = (VaryingComponentsTest *)local_168;
  ppcVar10 = &local_170;
  pTVar12 = local_178;
  ppcVar13 = &local_180;
  switch(test_case->m_layout) {
  case GVEC4:
    ppTVar14 = &local_190;
    pTVar15 = local_198;
    local_3a0 = &local_1a0;
    local_3a8 = local_1a8;
    local_3b0 = &local_1b0;
    local_398 = local_1b8;
    ppTVar7 = &local_1c0;
    this_00 = (VaryingComponentsTest *)(local_1e8 + 0x20);
    ppcVar10 = (char **)(local_1e8 + 0x18);
    pTVar12 = (TestNodeType *)(local_1e8 + 0x10);
    pcVar11 = "comp_x";
    TVar17 = 4;
    pcVar6 = "gvec4";
    desc_in[0].m_name = "gvec4";
    ppcVar13 = (char **)(local_1e8 + 8);
    desc_in[1].m_n_rows = 4;
    desc_in[1].m_name = "gvec4";
    lStackY_3c0 = 2;
    TVar8 = Float;
    break;
  case SCALAR_GVEC3:
    local_1e8._32_4_ = Double;
    desc_in[0].m_name = "scalar";
    desc_in[1].m_name = "scalar";
    pcVar11 = "comp_y";
    desc_in[2].m_component_str = "comp_y";
    desc_in[3].m_n_rows = 3;
    pcVar6 = "gvec3";
    desc_in[2].m_name = "gvec3";
    desc_in[3].m_component_str = "comp_y";
    desc_in[3].m_name = "gvec3";
    local_190 = (TestContext *)0x16d1ea2;
    goto LAB_00963050;
  case GVEC3_SCALAR:
    local_1e8._32_4_ = Uint;
    desc_in[0].m_name = "gvec3";
    desc_in[1].m_name = "gvec3";
    pcVar11 = "comp_w";
    desc_in[2].m_component_str = "comp_w";
    desc_in[3].m_n_rows = 1;
    pcVar6 = "scalar";
    desc_in[2].m_name = "scalar";
    desc_in[3].m_component_str = "comp_w";
    desc_in[3].m_name = "scalar";
    local_190 = (TestContext *)0x165dc07;
    goto LAB_00963050;
  case GVEC2_GVEC2:
    desc_in[3].m_n_rows = Int;
    pcVar6 = "gvec2";
    desc_in[0].m_name = "gvec2";
    desc_in[1].m_name = "gvec2";
    pcVar11 = "comp_z";
    desc_in[2].m_component_str = "comp_z";
    desc_in[2].m_name = "gvec2";
    desc_in[3].m_component_str = "comp_z";
    desc_in[3].m_name = "gvec2";
    local_190 = (TestContext *)0x165dc14;
    local_1e8._32_4_ = desc_in[3].m_n_rows;
LAB_00963050:
    local_1a0 = "last_output_location";
    local_1b0 = "comp_x";
    local_1b8[0] = Float;
    local_1e8._24_8_ = "first_output_location";
    local_1e8._16_4_ = 0;
    local_1e8._8_8_ = "comp_x";
    desc_in[3].m_location_str = "last_input_location";
    desc_in[2].m_location_str = "first_input_location";
    desc_in[2].m_location = 0;
    lStackY_3c0 = 4;
    ppTVar14 = &local_130;
    pTVar15 = local_138;
    TVar17 = desc_in[3].m_n_rows;
    TVar8 = local_1e8._32_4_;
    desc_in[1].m_n_rows = local_1e8._32_4_;
    desc_in[2].m_component = local_1e8._32_4_;
    desc_in[2].m_n_rows = desc_in[3].m_n_rows;
    desc_in[3].m_component = local_1e8._32_4_;
    desc_in[3].m_location = last_in_location;
    local_1c0 = local_190;
    local_1a8[0] = last_out_location;
    local_198[0] = local_1e8._32_4_;
    local_188 = local_1e8._32_4_;
    break;
  case GVEC2_SCALAR_SCALAR:
    desc_in[0].m_name = "gvec2";
    desc_in[1].m_name = "gvec2";
    desc_in[2].m_component_str = "comp_z";
    desc_in[2].m_name = "scalar";
    desc_in[3].m_component_str = "comp_z";
    desc_in[3].m_name = "scalar";
    local_1c0 = (TestContext *)0x165dc14;
    local_190 = (TestContext *)0x165dc14;
    local_180 = "comp_z";
    local_168._8_8_ = "scalar";
    local_168._16_4_ = Int;
    local_168._24_8_ = "comp_z";
    local_138[0] = Double;
    local_130 = (TestContext *)0x16d1ea2;
    goto LAB_00963263;
  case SCALAR_GVEC2_SCALAR:
    local_168._16_4_ = Double;
    desc_in[0].m_name = "scalar";
    desc_in[1].m_name = "scalar";
    desc_in[2].m_component_str = "comp_y";
    local_138[0] = Int;
    desc_in[2].m_name = "gvec2";
    desc_in[3].m_component_str = "comp_y";
    desc_in[3].m_name = "gvec2";
    local_1c0 = (TestContext *)0x16d1ea2;
    local_190 = (TestContext *)0x16d1ea2;
    local_180 = "comp_y";
    local_168._8_8_ = "gvec2";
    local_168._24_8_ = "comp_y";
    local_130 = (TestContext *)0x165dc14;
LAB_00963263:
    desc_in[5].m_component_str = "comp_w";
    desc_in[4].m_component_str = "comp_w";
    local_128._0_4_ = Uint;
    ppcVar13 = &local_120;
    pTVar12 = local_118;
    ppcVar10 = &local_110;
    puVar5 = local_108;
    puVar4 = local_108;
    puVar3 = local_108;
    puVar2 = local_108;
    local_3a0 = &local_e0;
    pTVar15 = local_d8;
    ppTVar14 = &local_d0;
    lStackY_3c0 = 6;
LAB_009632d3:
    local_398 = (TYPES *)(puVar4 + 0x10);
    local_3a8 = (GLuint *)(puVar2 + 0x20);
    local_3b0 = (char **)(puVar3 + 0x18);
    ppTVar7 = (TestContext **)(puVar5 + 8);
    desc_in[5].m_n_rows = 1;
    desc_in[4].m_n_rows = 1;
    local_140 = "last_output_location";
    local_170 = "first_output_location";
    local_178[0] = NODETYPE_ROOT;
    local_1a0 = "last_output_location";
    local_1b0 = "comp_x";
    local_1b8[0] = Float;
    local_1e8._24_8_ = "first_output_location";
    local_1e8._16_4_ = 0;
    local_1e8._8_8_ = "comp_x";
    desc_in[5].m_name = "scalar";
    desc_in[5].m_location_str = "last_input_location";
    desc_in[4].m_name = "scalar";
    desc_in[4].m_location_str = "first_input_location";
    desc_in[4].m_location = 0;
    desc_in[3].m_location_str = "last_input_location";
    desc_in[2].m_location_str = "first_input_location";
    desc_in[2].m_location = 0;
    pcVar11 = "comp_w";
    pcVar6 = "scalar";
    this_00 = pVVar9;
    TVar17 = Double;
    TVar8 = Uint;
    desc_in[1].m_n_rows = local_168._16_4_;
    desc_in[2].m_component = local_168._16_4_;
    desc_in[2].m_n_rows = local_138[0];
    desc_in[3].m_component = local_168._16_4_;
    desc_in[3].m_location = last_in_location;
    desc_in[3].m_n_rows = local_138[0];
    desc_in[4].m_component = local_128._0_4_;
    desc_in[5].m_component = local_128._0_4_;
    desc_in[5].m_location = last_in_location;
    local_1e8._32_4_ = local_168._16_4_;
    local_1a8[0] = last_out_location;
    local_198[0] = local_168._16_4_;
    local_188 = local_168._16_4_;
    local_168._0_4_ = local_138[0];
    local_168._32_4_ = last_out_location;
    break;
  case SCALAR_SCALAR_GVEC2:
    desc_in[1].m_n_rows = Double;
    desc_in[0].m_name = "scalar";
    desc_in[1].m_name = "scalar";
    desc_in[2].m_component_str = "comp_y";
    desc_in[2].m_location = 0;
    desc_in[2].m_location_str = "first_input_location";
    desc_in[2].m_name = "scalar";
    desc_in[3].m_component_str = "comp_y";
    desc_in[3].m_location_str = "last_input_location";
    desc_in[3].m_name = "scalar";
    desc_in[4].m_component = Int;
    pcVar11 = "comp_z";
    desc_in[4].m_component_str = "comp_z";
    desc_in[4].m_location = 0;
    desc_in[4].m_location_str = "first_input_location";
    pcVar6 = "gvec2";
    desc_in[4].m_name = "gvec2";
    desc_in[5].m_component_str = "comp_z";
    local_1e8._8_8_ = "comp_x";
    local_1e8._16_4_ = 0;
    desc_in[5].m_location_str = "last_input_location";
    local_1e8._24_8_ = "first_output_location";
    local_1c0 = (TestContext *)0x16d1ea2;
    local_1b8[0] = Float;
    local_1b0 = "comp_x";
    local_1a0 = "last_output_location";
    local_190 = (TestContext *)0x16d1ea2;
    local_180 = "comp_y";
    local_178[0] = NODETYPE_ROOT;
    local_170 = "first_output_location";
    local_168._8_8_ = "scalar";
    local_168._24_8_ = "comp_y";
    local_140 = "last_output_location";
    desc_in[5].m_name = "gvec2";
    local_130 = (TestContext *)0x16d1ea2;
    lStackY_3c0 = 6;
    ppcVar13 = &local_120;
    pTVar12 = local_118;
    ppcVar10 = &local_110;
    ppTVar7 = (TestContext **)(local_108 + 8);
    local_398 = (TYPES *)(local_108 + 0x10);
    local_3b0 = (char **)(local_108 + 0x18);
    local_3a8 = (GLuint *)(local_108 + 0x20);
    local_3a0 = &local_e0;
    pTVar15 = local_d8;
    ppTVar14 = &local_d0;
    this_00 = pVVar9;
    TVar17 = desc_in[4].m_component;
    TVar8 = desc_in[4].m_component;
    desc_in[2].m_component = desc_in[1].m_n_rows;
    desc_in[2].m_n_rows = desc_in[1].m_n_rows;
    desc_in[3].m_component = desc_in[1].m_n_rows;
    desc_in[3].m_location = last_in_location;
    desc_in[3].m_n_rows = desc_in[1].m_n_rows;
    desc_in[4].m_n_rows = desc_in[4].m_component;
    desc_in[5].m_component = desc_in[4].m_component;
    desc_in[5].m_location = last_in_location;
    desc_in[5].m_n_rows = desc_in[4].m_component;
    local_1e8._32_4_ = desc_in[1].m_n_rows;
    local_1a8[0] = last_out_location;
    local_198[0] = desc_in[1].m_n_rows;
    local_188 = desc_in[1].m_n_rows;
    local_168._0_4_ = desc_in[1].m_n_rows;
    local_168._16_4_ = desc_in[1].m_n_rows;
    local_168._32_4_ = last_out_location;
    local_138[0] = desc_in[1].m_n_rows;
    local_128._0_4_ = desc_in[4].m_component;
    break;
  case SCALAR_SCALAR_SCALAR_SCALAR:
    local_3a0 = (char **)(local_a8 + 0x28);
    puVar2 = local_a8;
    ppcVar13 = (char **)(local_c8 + 8);
    desc_in[6].m_n_rows = Double;
    desc_in[0].m_name = "scalar";
    desc_in[1].m_name = "scalar";
    desc_in[2].m_component_str = "comp_y";
    desc_in[2].m_name = "scalar";
    desc_in[3].m_component_str = "comp_y";
    desc_in[3].m_name = "scalar";
    local_128._0_4_ = Int;
    desc_in[4].m_component_str = "comp_z";
    desc_in[5].m_component_str = "comp_z";
    desc_in[6].m_component = 3;
    desc_in[6].m_component_str = "comp_w";
    desc_in[6].m_location = 0;
    desc_in[6].m_location_str = "first_input_location";
    ppTVar14 = (TestContext **)(local_a8 + 0x38);
    desc_in[6].m_name = "scalar";
    desc_in[7].m_component_str = "comp_w";
    desc_in[7].m_location_str = "last_input_location";
    local_1c0 = (TestContext *)0x16d1ea2;
    puVar3 = local_a8;
    local_190 = (TestContext *)0x16d1ea2;
    local_180 = "comp_y";
    local_168._8_8_ = "scalar";
    local_168._24_8_ = "comp_y";
    puVar4 = local_a8;
    local_130 = (TestContext *)0x16d1ea2;
    local_120 = "comp_z";
    local_118[0] = NODETYPE_ROOT;
    local_110 = "first_output_location";
    puVar5 = local_a8;
    local_108._8_8_ = "scalar";
    pVVar9 = (VaryingComponentsTest *)local_a8;
    local_108._24_8_ = "comp_z";
    ppcVar10 = &local_b0;
    local_e0 = "last_output_location";
    pTVar15 = (TYPES *)(local_a8 + 0x30);
    pTVar12 = local_b8;
    desc_in[7].m_name = "scalar";
    local_d0 = (TestContext *)0x16d1ea2;
    lStackY_3c0 = 8;
    desc_in[7].m_component = desc_in[6].m_component;
    desc_in[7].m_location = last_in_location;
    desc_in[7].m_n_rows = desc_in[6].m_n_rows;
    local_168._16_4_ = desc_in[6].m_n_rows;
    local_138[0] = desc_in[6].m_n_rows;
    local_108._0_4_ = desc_in[6].m_n_rows;
    local_108._16_4_ = local_128._0_4_;
    local_108._32_4_ = last_out_location;
    local_d8[0] = desc_in[6].m_n_rows;
    local_c8._0_4_ = desc_in[6].m_component;
    goto LAB_009632d3;
  }
  local_1e8._0_4_ = 0;
  desc_in[1].m_location_str = "last_input_location";
  desc_in[1].m_component_str = "comp_x";
  desc_in[1].m_component = 0;
  desc_in[0].m_location_str = "first_input_location";
  desc_in[0].m_location = 0;
  desc_in[0].m_component_str = "comp_x";
  desc_in[0].m_component = 0;
  *ppcVar13 = pcVar11;
  *pTVar12 = NODETYPE_ROOT;
  *ppcVar10 = "first_output_location";
  *(TYPES *)&(this_00->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.
             super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = TVar17;
  *ppTVar7 = (TestContext *)pcVar6;
  *local_398 = TVar8;
  *local_3b0 = pcVar11;
  *local_3a8 = last_out_location;
  *local_3a0 = "last_output_location";
  *pTVar15 = TVar17;
  *ppTVar14 = (TestContext *)pcVar6;
  desc_in[0].m_n_rows = desc_in[1].m_n_rows;
  desc_in[1].m_location = last_in_location;
LAB_00963590:
  pVVar9 = (VaryingComponentsTest *)(local_a8 + 0x48);
  for (lVar16 = 0; lStackY_3c0 * 0x30 - lVar16 != 0; lVar16 = lVar16 + 0x30) {
    this_00 = pVVar9;
    in = prepareVarying(this,(Type *)pVVar9,(descriptor *)((long)&desc_in[0].m_component + lVar16),
                        interpolation,si,stage,VARYING_INPUT);
    if (stage != FRAGMENT) {
      out = prepareVarying(this,(Type *)pVVar9,(descriptor *)(local_1e8 + lVar16),interpolation,si,
                           stage,VARYING_OUTPUT);
      this_00 = pVVar1;
      Utils::VaryingPassthrough::Add((VaryingPassthrough *)local_68._0_8_,stage,in,out);
    }
  }
  prepareGlobals_abi_cxx11_(&local_50,this_00,last_in_location,last_out_location);
  std::__cxx11::string::operator=((string *)si,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void VaryingComponentsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& vector_type,
											   Utils::ProgramInterface& program_interface, const testCase& test_case,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint			array_length = getArrayLength();
	const Utils::Type&		basic_type = Utils::Type::GetType(vector_type.m_basic_type, 1 /* n_cols */, 1 /* n_rows */);
	descriptor				desc_in[8];
	descriptor				desc_out[8];
	const GLuint			first_in_loc  = 0;
	const GLuint			first_out_loc = 0;
	const GLchar*			interpolation = "";
	const GLuint			last_in_loc   = getLastInputLocation(stage, vector_type, array_length);
	GLuint					last_out_loc  = 0;
	GLuint					n_desc		  = 0;
	Utils::ShaderInterface& si			  = program_interface.GetShaderInterface(stage);

	/* Select interpolation */
	if ((Utils::Shader::FRAGMENT == stage) || (Utils::Shader::GEOMETRY == stage))
	{
		interpolation = " flat";
	}

	if (Utils::Shader::FRAGMENT != stage)
	{
		last_out_loc = getLastOutputLocation(stage, vector_type, array_length);
	}

	switch (test_case.m_layout)
	{
	case GVEC4:
		n_desc = 2;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 4, "gvec4");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 4, "gvec4");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 4, "gvec4");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 4, "gvec4");
		break;
	case SCALAR_GVEC3:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 3, "gvec3");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 3, "gvec3");
		break;
	case GVEC3_SCALAR:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 3, "gvec3");
		desc_in[2].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 3, "gvec3");
		desc_out[2].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case GVEC2_GVEC2:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case GVEC2_SCALAR_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_GVEC2_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_SCALAR_GVEC2:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case SCALAR_SCALAR_SCALAR_SCALAR:
		n_desc = 8;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[6].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[7].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[6].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[7].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	}

	for (GLuint i = 0; i < n_desc; ++i)
	{
		const descriptor& in_desc = desc_in[i];

		Utils::Variable* in =
			prepareVarying(basic_type, in_desc, interpolation, si, stage, Utils::Variable::VARYING_INPUT);

		if (Utils::Shader::FRAGMENT != stage)
		{
			const descriptor& out_desc = desc_out[i];

			Utils::Variable* out =
				prepareVarying(basic_type, out_desc, interpolation, si, stage, Utils::Variable::VARYING_OUTPUT);

			varying_passthrough.Add(stage, in, out);
		}
	}

	si.m_globals = prepareGlobals(last_in_loc, last_out_loc);
}